

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

ValueImpl<false> * __thiscall
google::protobuf::io::Printer::ValueImpl<false>::operator=
          (ValueImpl<false> *this,ValueImpl<true> *that)

{
  function<bool_()> *__rhs;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  add_pointer_t<const_std::__cxx11::basic_string<char>_> local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  ValueImpl<true> *that_local;
  ValueImpl<false> *this_local;
  
  if ((ValueImpl<true> *)this != that) {
    str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)that;
    that_local = (ValueImpl<true> *)this;
    local_28 = std::get_if<std::__cxx11::string,std::__cxx11::string,std::function<bool()>>
                         (&that->value);
    if (local_28 == (add_pointer_t<const_std::__cxx11::basic_string<char>_>)0x0) {
      __rhs = std::get<std::function<bool()>,std::__cxx11::string,std::function<bool()>>
                        ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                          *)str);
      std::variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>::
      operator=((variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>
                 *)this,__rhs);
    }
    else {
      local_38 = (basic_string_view<char,_std::char_traits<char>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
      std::variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>::
      operator=((variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>
                 *)this,&local_38);
    }
    std::__cxx11::string::operator=
              ((string *)&this->consume_after,(string *)&str[1]._M_string_length);
    this->consume_parens_if_empty = (bool)((byte)str[2]._M_string_length & 1);
  }
  return this;
}

Assistant:

Printer::ValueImpl<owned>& Printer::ValueImpl<owned>::operator=(
    const ValueImpl<that_owned>& that) {
  // Cast to void* is required, since this and that may potentially be of
  // different types (due to the `that_owned` parameter).
  if (static_cast<const void*>(this) == static_cast<const void*>(&that)) {
    return *this;
  }

  using ThatStringType = typename ValueImpl<that_owned>::StringType;

  if (auto* str = std::get_if<ThatStringType>(&that.value)) {
    value = StringType(*str);
  } else {
    value = std::get<Callback>(that.value);
  }

  consume_after = that.consume_after;
  consume_parens_if_empty = that.consume_parens_if_empty;
  return *this;
}